

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O3

void WriteAllBoardsTest(BasePort *port,vector<AmpIO_*,_std::allocator<AmpIO_*>_> *boardList)

{
  AmpIO *this;
  long *plVar1;
  pointer ppAVar2;
  ulong uVar3;
  int axis;
  uint index;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Protocol: ",10);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,port->Protocol_);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  ppAVar2 = (boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppAVar2) {
    uVar3 = 0;
    do {
      AmpIO::WritePowerEnable(ppAVar2[uVar3],true);
      AmpIO::SetAmpEnableMask
                ((boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar3],0xf,0xf);
      AmpIO::SetSafetyRelay
                ((boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar3],true);
      index = 0;
      do {
        this = (boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar3];
        AmpIO::SetMotorCurrent
                  (this,index,
                   index + (uint)(this->super_FpgaIO).super_BoardIO.BoardId * 0x10 + 0x8000);
        index = index + 1;
      } while (index != 4);
      uVar3 = (ulong)((int)uVar3 + 1);
      ppAVar2 = (boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(boardList->super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3)
            );
  }
  (*port->_vptr_BasePort[0x21])(port);
  return;
}

Assistant:

void  WriteAllBoardsTest(BasePort *port, std::vector<AmpIO *> &boardList)
{
    std::cout << "Protocol: " << port->GetProtocol() << std::endl;
    for (unsigned int j = 0; j < boardList.size(); j++) {
        boardList[j]->WritePowerEnable(true);
        boardList[j]->SetAmpEnableMask(0x0f, 0x0f);
        boardList[j]->SetSafetyRelay(true);
        for (int axis = 0; axis < 4; axis++)
            boardList[j]->SetMotorCurrent(axis, 0x8000+16*boardList[j]->GetBoardId()+axis);
    }
    port->WriteAllBoards();
}